

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall
GameEngine::populationMove
          (GameEngine *this,shared_ptr<Population> *population,int32_t x_pos,int32_t y_pos)

{
  Map *this_00;
  CellType *this_01;
  int32_t iVar1;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar2;
  shared_ptr<Population> local_58;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = Population::GetYPos((population->
                              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pvVar2 = Map::operator[](this_00,(long)iVar1);
  iVar1 = Population::GetXPos((population->
                              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_58.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_58.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CellType::setCurrentPopulation
            ((pvVar2->
             super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
             )._M_impl.super__Vector_impl_data._M_start[iVar1].
             super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pvVar2 = Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (long)y_pos);
  this_01 = (pvVar2->
            super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
            )._M_impl.super__Vector_impl_data._M_start[x_pos].
            super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>);
  CellType::setCurrentPopulation(this_01,(shared_ptr<Population> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  Population::move((population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   x_pos,y_pos);
  return;
}

Assistant:

void GameEngine::populationMove(std::shared_ptr<Population> population, int32_t x_pos, int32_t y_pos) {
  (*map)[population->GetYPos()][population->GetXPos()]->setCurrentPopulation(nullptr);
  (*map)[y_pos][x_pos]->setCurrentPopulation(population);

  population->move(x_pos, y_pos);
}